

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * findlocal(lua_State *L,CallInfo *ci,int n,StkId *pos)

{
  byte bVar1;
  Proto *f;
  int pc;
  char *pcVar2;
  uint uVar3;
  StkId pTVar4;
  uint uVar5;
  CallInfo *pCVar6;
  
  if ((ci->callstatus & 2) == 0) {
    pTVar4 = ci->func + 1;
LAB_00107474:
    if (L->ci == ci) {
      pCVar6 = (CallInfo *)&L->top;
    }
    else {
      pCVar6 = ci->next;
    }
    if (n < 1) {
      return (char *)0x0;
    }
    if ((long)pCVar6->func - (long)pTVar4 >> 4 < (long)n) {
      return (char *)0x0;
    }
    pcVar2 = "(*temporary)";
  }
  else {
    if (n < 0) {
      uVar5 = -n;
      pTVar4 = ci->func;
      bVar1 = *(byte *)(*(long *)((pTVar4->value_).f + 0x18) + 10);
      uVar3 = (int)((ulong)((long)(ci->u).l.base - (long)pTVar4) >> 4) - (uint)bVar1;
      if (uVar3 == uVar5 || SBORROW4(uVar3,uVar5) != (int)(uVar3 + n) < 0) {
        return (char *)0x0;
      }
      pTVar4 = pTVar4 + (ulong)bVar1 + (ulong)uVar5;
      pcVar2 = "(*vararg)";
      goto LAB_001074e1;
    }
    pTVar4 = (ci->u).l.base;
    f = *(Proto **)((ci->func->value_).f + 0x18);
    pc = currentpc(ci);
    pcVar2 = luaF_getlocalname(f,n,pc);
    if (pcVar2 == (char *)0x0) goto LAB_00107474;
  }
  pTVar4 = pTVar4 + (long)n + -1;
LAB_001074e1:
  *pos = pTVar4;
  return pcVar2;
}

Assistant:

static const char *findlocal (lua_State *L, CallInfo *ci, int n,
                              StkId *pos) {
  const char *name = NULL;
  StkId base;
  if (isLua(ci)) {
    if (n < 0)  /* access to vararg values? */
      return findvararg(ci, -n, pos);
    else {
      base = ci->u.l.base;
      name = luaF_getlocalname(ci_func(ci)->p, n, currentpc(ci));
    }
  }
  else
    base = ci->func + 1;
  if (name == NULL) {  /* no 'standard' name? */
    StkId limit = (ci == L->ci) ? L->top : ci->next->func;
    if (limit - base >= n && n > 0)  /* is 'n' inside 'ci' stack? */
      name = "(*temporary)";  /* generic name for any valid slot */
    else
      return NULL;  /* no name */
  }
  *pos = base + (n - 1);
  return name;
}